

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vkSpirVProgram.cpp
# Opt level: O2

TestLog * vk::operator<<(TestLog *log,SpirVAsmSource *source)

{
  size_t in_RCX;
  void *__buf;
  allocator<char> local_89;
  char *local_88 [4];
  string local_68 [32];
  undefined1 local_48 [40];
  
  std::__cxx11::string::string<std::allocator<char>>(local_68,"",&local_89);
  local_48[0] = true;
  std::__cxx11::string::string((string *)(local_48 + 8),local_68);
  tcu::LogShaderProgram::write((LogShaderProgram *)local_48,(int)log,__buf,in_RCX);
  std::__cxx11::string::string((string *)local_88,(string *)source);
  tcu::TestLog::writeSpirVAssemblySource(log,local_88[0]);
  tcu::TestLog::endShaderProgram(log);
  std::__cxx11::string::~string((string *)local_88);
  std::__cxx11::string::~string((string *)(local_48 + 8));
  std::__cxx11::string::~string(local_68);
  return log;
}

Assistant:

tcu::TestLog& operator<< (tcu::TestLog& log, const SpirVAsmSource& source)
{
	log << tcu::TestLog::ShaderProgram(true , "")
		<< tcu::TestLog::SpirVAssemblySource(source.source)
		<< tcu::TestLog::EndShaderProgram;

	return log;
}